

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O2

MIR_op_mode_t MIR_insn_op_mode(MIR_context_t ctx,MIR_insn_t_conflict insn,size_t nop,int *out_p)

{
  byte bVar1;
  MIR_label_t pMVar2;
  VARR_MIR_var_t *varr;
  int iVar3;
  MIR_op_mode_t MVar4;
  size_t sVar5;
  size_t sVar6;
  MIR_proto_t pMVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uStack_60;
  MIR_var_t local_48;
  
  uVar9 = *(ulong *)&insn->field_0x18;
  sVar5 = MIR_insn_nops(ctx,insn);
  *out_p = 0;
  if (sVar5 <= nop) {
    return MIR_OP_BOUND;
  }
  iVar3 = (int)uVar9;
  if (iVar3 - 0x1eU < 4) {
    *out_p = (uint)(nop == 0);
    if (nop != 0) goto LAB_0011201a;
  }
  else {
    if (iVar3 - 0xa7U < 2) {
      if ((insn->ops[0].field_0x8 != '\b') ||
         (pMVar2 = insn->ops[0].u.label, *(int *)&pMVar2->ops[0].data != 1)) {
        __assert_fail("proto_op.mode == MIR_OP_REF && proto_op.u.ref->item_type == MIR_proto_item",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                      ,0x848,
                      "MIR_op_mode_t MIR_insn_op_mode(MIR_context_t, MIR_insn_t, size_t, int *)");
      }
      pMVar7 = *(MIR_proto_t *)((long)&pMVar2->ops[0].u + 0x10);
      uStack_60 = 2;
    }
    else {
      if (iVar3 - 0xaaU < 2) {
        if (nop == 0 && iVar3 != 0xab) {
          return MIR_OP_INT;
        }
LAB_0011201a:
        return (uint)(byte)insn->ops[nop].field_0x8;
      }
      if (iVar3 != 0xb5) {
        if (iVar3 != 0xb9) {
          if (iVar3 != 0xba) {
            bVar1 = *(byte *)(nop + (uVar9 & 0xffffffff) * 0x18 + 0x1a6b40);
            if ((char)bVar1 < '\0') {
              *out_p = 1;
              return bVar1 & 0x7f;
            }
            return (uint)bVar1;
          }
          *out_p = (uint)(nop == 0);
        }
        goto LAB_0011201a;
      }
      if (insn->ops[0].field_0x8 != '\x03') {
        __assert_fail("insn->ops[0].mode == MIR_OP_INT",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                      ,0x842,
                      "MIR_op_mode_t MIR_insn_op_mode(MIR_context_t, MIR_insn_t, size_t, int *)");
      }
      uVar9 = insn->ops[0].u.u;
      sVar6 = VARR_MIR_proto_tlength(ctx->unspec_protos);
      if (sVar6 <= uVar9) {
        __assert_fail("insn->ops[0].u.u < (VARR_MIR_proto_tlength (ctx->unspec_protos))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                      ,0x843,
                      "MIR_op_mode_t MIR_insn_op_mode(MIR_context_t, MIR_insn_t, size_t, int *)");
      }
      pMVar7 = VARR_MIR_proto_tget(ctx->unspec_protos,insn->ops[0].u.str.len);
      uStack_60 = 1;
    }
    uVar8 = 0;
    if (uStack_60 <= nop) {
      uVar8 = (uint)(nop < pMVar7->nres + uStack_60);
    }
    *out_p = uVar8;
    varr = pMVar7->args;
    uVar9 = pMVar7->nres + uStack_60;
    if (varr == (VARR_MIR_var_t *)0x0) {
      sVar6 = 0;
    }
    else {
      sVar6 = varr->els_num;
    }
    uVar10 = sVar6 + uVar9;
    if ((pMVar7->vararg_p != '\0') && (uVar10 <= nop)) {
      return MIR_OP_UNDEF;
    }
    if ((sVar5 < uVar10) || ((pMVar7->vararg_p == '\0' && (sVar5 != uVar10)))) {
      __assert_fail("nops >= nargs && (proto->vararg_p || nops == nargs)",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                    ,0x84f,
                    "MIR_op_mode_t MIR_insn_op_mode(MIR_context_t, MIR_insn_t, size_t, int *)");
    }
    if (nop == 0) {
      return (uint)(byte)insn->ops[0].field_0x8;
    }
    if (nop != 1 || iVar3 == 0xb5) {
      if ((nop < uStack_60) || (uVar9 <= nop)) {
        VARR_MIR_var_tget(&local_48,varr,nop - uVar9);
      }
      else {
        local_48.type = pMVar7->res_types[nop - uStack_60];
      }
      MVar4 = type2mode(local_48.type);
      return MVar4;
    }
  }
  return MIR_OP_INT;
}

Assistant:

MIR_op_mode_t MIR_insn_op_mode (MIR_context_t ctx, MIR_insn_t insn, size_t nop, int *out_p) {
  MIR_insn_code_t code = insn->code;
  size_t nargs, nops = MIR_insn_nops (ctx, insn);
  unsigned mode;

  *out_p = FALSE; /* to remove unitialized warning */
  if (nop >= nops) return MIR_OP_BOUND;
  mir_assert (out_p != NULL);
  switch (code) {
  case MIR_RET:
  case MIR_SWITCH:
    /* should be already checked in MIR_finish_func */
    return nop == 0 && code != MIR_RET ? MIR_OP_INT : insn->ops[nop].mode;
  case MIR_ADDR:
  case MIR_ADDR8:
  case MIR_ADDR16:
  case MIR_ADDR32: *out_p = nop == 0; return nop == 0 ? MIR_OP_INT : insn->ops[nop].mode;
  case MIR_PHI: *out_p = nop == 0; return insn->ops[nop].mode;
  case MIR_USE: return insn->ops[nop].mode;
  case MIR_CALL:
  case MIR_INLINE:
  case MIR_UNSPEC: {
    MIR_op_t proto_op;
    MIR_proto_t proto;
    size_t args_start;

    if (code == MIR_UNSPEC) {
      args_start = 1;
      mir_assert (insn->ops[0].mode == MIR_OP_INT);
      mir_assert (insn->ops[0].u.u < VARR_LENGTH (MIR_proto_t, unspec_protos));
      proto = VARR_GET (MIR_proto_t, unspec_protos, insn->ops[0].u.u);
    } else {
      args_start = 2;
      proto_op = insn->ops[0];
      mir_assert (proto_op.mode == MIR_OP_REF && proto_op.u.ref->item_type == MIR_proto_item);
      proto = proto_op.u.ref->u.proto;
    }
    *out_p = args_start <= nop && nop < proto->nres + args_start;
    nargs
      = proto->nres + args_start + (proto->args == NULL ? 0 : VARR_LENGTH (MIR_var_t, proto->args));
    if (proto->vararg_p && nop >= nargs) return MIR_OP_UNDEF; /* unknown */
    mir_assert (nops >= nargs && (proto->vararg_p || nops == nargs));
    if (nop == 0) return insn->ops[nop].mode;
    if (nop == 1 && code != MIR_UNSPEC) return MIR_OP_INT; /* call func addr */
    if (args_start <= nop && nop < proto->nres + args_start)
      return type2mode (proto->res_types[nop - args_start]);
    return type2mode (VARR_GET (MIR_var_t, proto->args, nop - args_start - proto->nres).type);
  }
  default:
    mode = insn_descs[code].op_modes[nop];
    if ((mode & OUT_FLAG) == 0) return mode;
    *out_p = TRUE;
    return mode ^ OUT_FLAG;
  }
}